

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O0

void __thiscall Qentem::StringStream<char>::expand(StringStream<char> *this,SizeT new_capacity)

{
  SizeT size_00;
  char *from;
  char *to;
  char *str;
  SizeT size;
  SizeT new_capacity_local;
  StringStream<char> *this_local;
  
  from = Storage(this);
  allocate(this,new_capacity << 2);
  to = Storage(this);
  size_00 = Length(this);
  Memory::Copy<unsigned_int>(to,from,size_00);
  Memory::Deallocate(from);
  return;
}

Assistant:

void expand(const SizeT new_capacity) {
        constexpr SizeT size = sizeof(Char_T);
        Char_T         *str  = Storage();

        allocate(new_capacity * SizeT{4});

        Memory::Copy(Storage(), str, (Length() * size));
        Memory::Deallocate(str);
    }